

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O1

void findMatches(vector<extrema,_std::allocator<extrema>_> *ex1,
                vector<extrema,_std::allocator<extrema>_> *ex2,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP1,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP2,uint *cnt_match
                )

{
  pointer pdVar1;
  double dVar2;
  pointer peVar3;
  long lVar4;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *this;
  uint *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ostream *poVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  pair<double,_int> pVar20;
  vector<double,_std::allocator<double>_> everyMinDist;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  everyDist;
  vector<int,_std::allocator<int>_> SecondMinIdx;
  vector<double,_std::allocator<double>_> everySecondMinDist;
  vector<int,_std::allocator<int>_> MinIdx;
  value_type local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_d8;
  vector<extrema,_std::allocator<extrema>_> *local_c0;
  Point_<int> local_b8;
  int local_b0 [2];
  vector<int,_std::allocator<int>_> local_a8;
  vector<double,_std::allocator<double>_> local_88;
  vector<int,_std::allocator<int>_> local_68;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_48;
  uint *local_40;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_38;
  
  local_d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = ex1;
  local_48 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP2;
  local_40 = cnt_match;
  local_38 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP1;
  if ((ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar11 = 0;
    do {
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      if ((ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar15 = 0;
        do {
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          peVar3 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)*(pointer *)
                         ((long)&peVar3[uVar15].NeighborCells.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl + 8) -
                  *(long *)&peVar3[uVar15].NeighborCells.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl;
          if (lVar6 != 0) {
            lVar7 = (lVar6 >> 3) * -0x5555555555555555;
            pdVar1 = (pointer)0x0;
            lVar6 = *(long *)&(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                              super__Vector_impl_data._M_start[uVar15].NeighborCells.
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl;
            lVar12 = 0;
            do {
              lVar4 = *(long *)(lVar6 + lVar12 * 0x18);
              lVar13 = *(long *)(lVar6 + 8 + lVar12 * 0x18) - lVar4;
              if (lVar13 != 0) {
                lVar13 = lVar13 >> 3;
                lVar14 = 0;
                do {
                  dVar19 = *(double *)
                            (*(long *)(*(long *)&(local_c0->
                                                 super__Vector_base<extrema,_std::allocator<extrema>_>
                                                 )._M_impl.super__Vector_impl_data._M_start[uVar11].
                                                 NeighborCells.
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + lVar12 * 0x18) +
                            lVar14 * 8) - *(double *)(lVar4 + lVar14 * 8);
                  pdVar1 = (pointer)((double)pdVar1 + dVar19 * dVar19);
                  lVar14 = lVar14 + 1;
                  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = pdVar1;
                } while (lVar13 + (ulong)(lVar13 == 0) != lVar14);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != lVar7 + (ulong)(lVar7 == 0));
          }
          if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)&local_88);
          }
          else {
            *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish =
                 (double)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar15 = uVar15 + 1;
          uVar8 = ((long)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
        } while (uVar15 <= uVar8 && uVar8 - uVar15 != 0);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_d8,&local_f8);
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar11 = uVar11 + 1;
      uVar15 = ((long)(local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar11 <= uVar15 && uVar15 - uVar11 != 0);
  }
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  if (local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      pdVar1 = local_d8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar16 = 0;
      uVar18 = 0x4197d784;
      uVar17 = 0;
      lVar6 = (long)local_d8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
      if (lVar6 != 0) {
        lVar6 = lVar6 >> 3;
        uVar8 = 0;
        uVar15 = 0;
        dVar19 = 100000000.0;
        do {
          dVar2 = pdVar1[uVar8];
          uVar16 = SUB84(dVar2,0);
          uVar18 = (undefined4)((ulong)dVar2 >> 0x20);
          if (dVar2 < dVar19) {
            uVar15 = uVar8 & 0xffffffff;
          }
          uVar17 = (undefined4)uVar15;
          if (dVar19 <= dVar2) {
            uVar16 = SUB84(dVar19,0);
            uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
          }
          uVar8 = uVar8 + 1;
          dVar19 = (double)CONCAT44(uVar18,uVar16);
        } while (lVar6 + (ulong)(lVar6 == 0) != uVar8);
      }
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(uVar18,uVar16);
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = uVar17;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_a8);
      }
      else {
        *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)CONCAT44(uVar18,uVar16);
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pdVar1 = local_d8.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar6 = (long)local_d8.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar11].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1;
      if (lVar6 == 0) {
        iVar10 = 0;
        uVar17 = 0;
        uVar16 = 0x4197d784;
      }
      else {
        lVar6 = lVar6 >> 3;
        uVar8 = 0;
        uVar15 = 0;
        dVar19 = 100000000.0;
        do {
          dVar2 = pdVar1[uVar8];
          uVar17 = SUB84(dVar2,0);
          uVar16 = (undefined4)((ulong)dVar2 >> 0x20);
          if (dVar2 < dVar19) {
            uVar15 = uVar8 & 0xffffffff;
          }
          iVar10 = (int)uVar15;
          if (dVar19 <= dVar2) {
            uVar17 = SUB84(dVar19,0);
            uVar16 = (undefined4)((ulong)dVar19 >> 0x20);
          }
          uVar8 = uVar8 + 1;
          dVar19 = (double)CONCAT44(uVar16,uVar17);
        } while (lVar6 + (ulong)(lVar6 == 0) != uVar8);
      }
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(uVar16,uVar17);
      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_,iVar10);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (int *)&local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      else {
        *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar10;
        local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
      uVar15 = ((long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar11 <= uVar15 && uVar15 - uVar11 != 0);
  }
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
    lVar6 = 0;
    uVar11 = 0;
    do {
      pVar20 = secondMin((vector<double,_std::allocator<double>_> *)
                         ((long)&((local_d8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),
                         (int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar6));
      local_b8 = (Point_<int>)pVar20.first;
      local_b0[0] = pVar20.second;
      if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_b8);
      }
      else {
        *local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_b8;
        local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pVar20 = secondMin((vector<double,_std::allocator<double>_> *)
                         ((long)&((local_d8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar7),
                         (int *)((long)local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar6));
      local_b8 = (Point_<int>)pVar20.first;
      local_b0[0] = pVar20.second;
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_b0);
      }
      else {
        *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_b0[0];
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar11 = uVar11 + 1;
      uVar15 = ((long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar6 = lVar6 + 4;
      lVar7 = lVar7 + 0x18;
    } while (uVar11 <= uVar15 && uVar15 - uVar11 != 0);
  }
  puVar5 = local_40;
  this = local_48;
  if (local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar11 = 0;
    do {
      if ((local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar11] < 1.0) ||
         (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] /
          local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar11] < 0.8)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
        poVar9 = std::ostream::_M_insert<double>
                           ((double)*(float *)((long)&(((local_c0->
                                                                                                                
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).x
                                              + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = std::ostream::_M_insert<double>
                           ((double)*(float *)((long)&(((local_c0->
                                                                                                                
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).y
                                              + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,") match (",9);
        poVar9 = std::ostream::_M_insert<double>
                           ((double)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>).
                                    _M_impl.super__Vector_impl_data._M_start
                                    [local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar11]].pt.x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
        poVar9 = std::ostream::_M_insert<double>
                           ((double)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>).
                                    _M_impl.super__Vector_impl_data._M_start
                                    [local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar11]].pt.y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        peVar3 = (local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_b8.y = (int)ROUND(*(float *)((long)&(peVar3->pt).y + lVar6));
        local_b8.x = (int)ROUND(*(float *)((long)&(peVar3->pt).x + lVar6));
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                  (local_38,&local_b8);
        peVar3 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_b8.y = (int)ROUND(peVar3[local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar11]].pt.y);
        local_b8.x = (int)ROUND(peVar3[local_68.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar11]].pt.x);
        std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                  (this,&local_b8);
        *puVar5 = *puVar5 + 1;
      }
      uVar11 = uVar11 + 1;
      uVar15 = ((long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_d8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar6 = lVar6 + 0x70;
    } while (uVar11 <= uVar15 && uVar15 - uVar11 != 0);
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void findMatches(const vector<extrema>& ex1, const vector<extrema>& ex2, vector<Point>& matchKP1, vector<Point>& matchKP2, unsigned& cnt_match){
    double min_dist = 1000;
    for(const auto& i:ex1){
        for(const auto& j:ex2){
            double dist = 0;
            for(int k = 0; k < j.NeighborCells.size(); k++){
                for(int l = 0; l < j.NeighborCells[k].size(); l++){
                    dist += pow(i.NeighborCells[k][l] - j.NeighborCells[k][l], 2);
                }
            }
            if(dist < min_dist) min_dist = dist;
        }
    }

    vector<vector<double> > everyDist;
    for(int i = 0; i < ex1.size(); i++){
        vector<double> tmpEveryDist;
        for(int j = 0; j < ex2.size(); j++){
            double tmpSum = 0;
            for(int k = 0; k < ex2[j].NeighborCells.size(); k++){
                for(int l = 0; l < ex2[j].NeighborCells[k].size(); l++){
                    tmpSum += pow(ex1[i].NeighborCells[k][l] - ex2[j].NeighborCells[k][l], 2);
                }
            }
            tmpEveryDist.push_back(tmpSum);
        }
        everyDist.push_back(tmpEveryDist);
    }

    vector<double> everyMinDist, everySecondMinDist;
    vector<int> MinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everyMinDist.push_back(Min(everyDist[i]).first);
        MinIdx.push_back(Min(everyDist[i]).second);
    }
    vector<int> SecondMinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everySecondMinDist.push_back(secondMin(everyDist[i], MinIdx[i]).first);
        SecondMinIdx.push_back(secondMin(everyDist[i], MinIdx[i]).second);
    }
    for(int i = 0; i < everyDist.size(); i++){
        if(everyMinDist[i]/double(everySecondMinDist[i]) < match_ratio || everyMinDist[i] < 1 ){
            cout << "(" << ex1[i].pt.x << ", " << ex1[i].pt.y << ") match ("
                << ex2[MinIdx[i]].pt.x << ", " << ex2[MinIdx[i]].pt.y << ")" << endl;
            matchKP1.push_back(ex1[i].pt);
            matchKP2.push_back(ex2[MinIdx[i]].pt);
            cnt_match++;
        }
    }
}